

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

Vec_Int_t * Vec_IntAllocArrayCopy(int *pArray,int nSize)

{
  Vec_Int_t *pVVar1;
  int *piVar2;
  Vec_Int_t *p;
  int nSize_local;
  int *pArray_local;
  
  pVVar1 = (Vec_Int_t *)malloc(0x10);
  pVVar1->nSize = nSize;
  pVVar1->nCap = nSize;
  piVar2 = (int *)malloc((long)nSize << 2);
  pVVar1->pArray = piVar2;
  memcpy(pVVar1->pArray,pArray,(long)nSize << 2);
  return pVVar1;
}

Assistant:

static inline Vec_Int_t * Vec_IntAllocArrayCopy( int * pArray, int nSize )
{
    Vec_Int_t * p;
    p = ABC_ALLOC( Vec_Int_t, 1 );
    p->nSize  = nSize;
    p->nCap   = nSize;
    p->pArray = ABC_ALLOC( int, nSize );
    memcpy( p->pArray, pArray, sizeof(int) * (size_t)nSize );
    return p;
}